

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O2

string_t duckdb::StringCast::Operation<duckdb::date_t>(date_t input,Vector *vector)

{
  undefined **ppuVar1;
  Vector *vector_00;
  idx_t len;
  char *data;
  anon_union_16_2_67f50693_for_value aVar2;
  bool add_bc;
  int32_t date [3];
  idx_t year_length;
  bool local_45;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c;
  idx_t local_38;
  anon_union_16_2_67f50693_for_value local_30;
  
  if (input.days == -0x7fffffff) {
    ppuVar1 = &Date::NINF;
  }
  else {
    if (input.days != 0x7fffffff) {
      Date::Convert(input,&local_44,&local_40,&local_3c);
      vector_00 = (Vector *)DateToStringCast::YearLength(&local_44,&local_38,&local_45);
      local_30.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::EmptyString((StringVector *)vector,vector_00,len);
      data = local_30.pointer.prefix;
      if (0xc < local_30._0_4_) {
        data = local_30._8_8_;
      }
      DateToStringCast::Format(data,&local_44,local_38,local_45);
      string_t::Finalize((string_t *)&local_30.pointer);
      return (string_t)local_30.pointer;
    }
    ppuVar1 = (undefined **)&Date::PINF;
  }
  aVar2.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(vector,*ppuVar1);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

duckdb::string_t StringCast::Operation(date_t input, Vector &vector) {
	if (input == date_t::infinity()) {
		return StringVector::AddString(vector, Date::PINF);
	} else if (input == date_t::ninfinity()) {
		return StringVector::AddString(vector, Date::NINF);
	}
	int32_t date[3];
	Date::Convert(input, date[0], date[1], date[2]);

	idx_t year_length;
	bool add_bc;
	idx_t length = DateToStringCast::Length(date, year_length, add_bc);

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	DateToStringCast::Format(data, date, year_length, add_bc);

	result.Finalize();
	return result;
}